

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

void __thiscall Rml::ElementDocument::ElementDocument(ElementDocument *this,String *tag)

{
  Property local_70;
  
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementDocument_003358c0;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->source_url)._M_dataplus._M_p = (pointer)&(this->source_url).field_2;
  (this->source_url)._M_string_length = 0;
  (this->source_url).field_2._M_local_buf[0] = '\0';
  (this->style_sheet_container).
  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->style_sheet_container).
  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->style_sheet_container).
           super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 2) = 0;
  *(undefined8 *)((long)&this->context + 2) = 0;
  this->layout_dirty = true;
  this->position_dirty = false;
  Element::ForceLocalStackingContext(&this->super_Element);
  Element::SetOwnerDocument(&this->super_Element,this);
  local_70.value.type = NONE;
  Variant::Set(&local_70.value,2);
  local_70.unit = KEYWORD;
  local_70.specificity = -1;
  local_70.definition = (PropertyDefinition *)0x0;
  local_70.parser_index = -1;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(&this->super_Element,Position,&local_70);
  if (local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.
               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Variant::~Variant(&local_70.value);
  return;
}

Assistant:

ElementDocument::ElementDocument(const String& tag) : Element(tag)
{
	context = nullptr;

	modal = false;
	focusable_from_modal = false;

	layout_dirty = true;
	position_dirty = false;

	ForceLocalStackingContext();
	SetOwnerDocument(this);

	SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
}